

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Filesystem.cc
# Opt level: O0

char * phosg::getcwd_abi_cxx11_(char *__buf,size_t __size)

{
  char *pcVar1;
  size_type __size_00;
  runtime_error *this;
  size_t __n;
  allocator<char> local_12;
  undefined1 local_11;
  char *local_10;
  string *ret;
  
  local_11 = 0;
  local_10 = __buf;
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string<std::allocator<char>>((string *)__buf,0x1000,'\0',&local_12);
  ::std::allocator<char>::~allocator(&local_12);
  pcVar1 = ::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::data
                     ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__buf);
  __size_00 = ::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
              size((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__buf);
  pcVar1 = ::getcwd(pcVar1,__size_00);
  if (pcVar1 != (char *)0x0) {
    pcVar1 = ::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
             c_str((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__buf);
    __n = strlen(pcVar1);
    ::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::resize
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__buf,__n);
    return __buf;
  }
  this = (runtime_error *)__cxa_allocate_exception(0x10);
  ::std::runtime_error::runtime_error(this,"cannot get working directory");
  __cxa_throw(this,&::std::runtime_error::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

string getcwd() {
  string ret(MAXPATHLEN, '\0');
  if (!::getcwd(ret.data(), ret.size())) {
    throw runtime_error("cannot get working directory");
  }
  ret.resize(strlen(ret.c_str()));
  return ret;
}